

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blowfish.c
# Opt level: O1

void Blowfish_expand0state(blf_ctx *c,uint8_t *key,uint16_t keybytes)

{
  long lVar1;
  ushort uVar2;
  char cVar3;
  uint uVar4;
  ulong uVar5;
  uint32_t *puVar6;
  uint32_t datar;
  uint32_t datal;
  uint32_t local_38 [2];
  
  lVar1 = 0;
  uVar2 = 0;
  do {
    cVar3 = '\x04';
    uVar4 = 0;
    do {
      if (0x3f < uVar2) {
        uVar2 = 0;
      }
      uVar4 = (uint)key[uVar2] | uVar4 << 8;
      uVar2 = uVar2 + 1;
      cVar3 = cVar3 + -1;
    } while (cVar3 != '\0');
    c->P[lVar1] = c->P[lVar1] ^ uVar4;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x12);
  local_38[0] = 0;
  local_38[1] = 0;
  uVar5 = 0xfffffffffffffffe;
  do {
    Blowfish_encipher(c,local_38 + 1,local_38);
    c->P[uVar5 + 2] = local_38[1];
    c->P[uVar5 + 3] = local_38[0];
    uVar5 = uVar5 + 2;
  } while (uVar5 < 0x10);
  puVar6 = c->S[0] + 1;
  lVar1 = 0;
  do {
    uVar5 = 0xfffffffffffffffe;
    do {
      Blowfish_encipher(c,local_38 + 1,local_38);
      puVar6[uVar5 + 1] = local_38[1];
      puVar6[uVar5 + 2] = local_38[0];
      uVar5 = uVar5 + 2;
    } while (uVar5 < 0xfe);
    lVar1 = lVar1 + 1;
    puVar6 = puVar6 + 0x100;
  } while (lVar1 != 4);
  return;
}

Assistant:

static void
Blowfish_expand0state(blf_ctx *c, const uint8_t *key, uint16_t keybytes)
{
    int i;
    int k;
    uint16_t j;
    uint32_t temp;
    uint32_t datal;
    uint32_t datar;

    j = 0;
    for(i = 0; i < BLF_N + 2; i++) {
        /* Extract 4 int8 to 1 int32 from keystream */
        temp = Blowfish_stream2word(key, keybytes, &j);
        c->P[i] = c->P[i] ^ temp;
    }

    j = 0;
    datal = 0x00000000;
    datar = 0x00000000;
    for(i = 0; i < BLF_N + 2; i += 2) {
        Blowfish_encipher(c, &datal, &datar);

        c->P[i] = datal;
        c->P[i + 1] = datar;
    }

    for(i = 0; i < 4; i++) {
        for(k = 0; k < 256; k += 2) {
            Blowfish_encipher(c, &datal, &datar);

            c->S[i][k] = datal;
            c->S[i][k + 1] = datar;
        }
    }
}